

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

ssize_t phr_decode_chunked(phr_chunked_decoder *decoder,char *buf,size_t *_bufsz)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  ulong __n;
  size_t sVar4;
  size_t avail;
  long lStack_40;
  int v;
  ssize_t ret;
  size_t bufsz;
  size_t src;
  size_t dst;
  size_t *_bufsz_local;
  char *buf_local;
  phr_chunked_decoder *decoder_local;
  
  src = 0;
  bufsz = 0;
  sVar2 = *_bufsz;
  lStack_40 = -2;
LAB_00108b37:
  switch(decoder->_state) {
  case '\0':
    goto switchD_00108b60_caseD_0;
  case '\x01':
    goto switchD_00108b60_caseD_1;
  case '\x02':
    goto switchD_00108b60_caseD_2;
  case '\x03':
    goto switchD_00108b60_caseD_3;
  case '\x04':
    while( true ) {
      if (bufsz == sVar2) goto LAB_00108e76;
      if (buf[bufsz] != '\r') break;
      bufsz = bufsz + 1;
    }
    sVar4 = bufsz + 1;
    pcVar1 = buf + bufsz;
    bufsz = sVar4;
    if (*pcVar1 != '\n') {
      decoder->_state = '\x05';
      break;
    }
    goto LAB_00108e6a;
  case '\x05':
    break;
  default:
    __assert_fail("!\"decoder is corrupt\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/clask/../clask/picohttpparser.c"
                  ,0x275,
                  "ssize_t phr_decode_chunked(struct phr_chunked_decoder *, char *, size_t *)");
  }
  while( true ) {
    if (bufsz == sVar2) goto LAB_00108e76;
    if (buf[bufsz] == '\n') break;
    bufsz = bufsz + 1;
  }
  bufsz = bufsz + 1;
  decoder->_state = '\x04';
  goto LAB_00108b37;
switchD_00108b60_caseD_0:
  while( true ) {
    if (bufsz == sVar2) goto LAB_00108e76;
    iVar3 = decode_hex((int)buf[bufsz]);
    if (iVar3 == -1) break;
    if (decoder->_hex_count == '\x10') {
      lStack_40 = -1;
      goto LAB_00108e76;
    }
    decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk * 0x10 + (long)iVar3;
    decoder->_hex_count = decoder->_hex_count + '\x01';
    bufsz = bufsz + 1;
  }
  if (decoder->_hex_count == '\0') {
    lStack_40 = -1;
    goto LAB_00108e76;
  }
  decoder->_hex_count = '\0';
  decoder->_state = '\x01';
switchD_00108b60_caseD_1:
  while( true ) {
    if (bufsz == sVar2) goto LAB_00108e76;
    if (buf[bufsz] == '\n') break;
    bufsz = bufsz + 1;
  }
  bufsz = bufsz + 1;
  if (decoder->bytes_left_in_chunk == 0) {
    if (decoder->consume_trailer != '\0') {
      decoder->_state = '\x04';
      goto LAB_00108b37;
    }
LAB_00108e6a:
    lStack_40 = sVar2 - bufsz;
  }
  else {
    decoder->_state = '\x02';
switchD_00108b60_caseD_2:
    __n = sVar2 - bufsz;
    if (__n < decoder->bytes_left_in_chunk) {
      if (src != bufsz) {
        memmove(buf + src,buf + bufsz,__n);
      }
      bufsz = __n + bufsz;
      src = __n + src;
      decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk - __n;
    }
    else {
      if (src != bufsz) {
        memmove(buf + src,buf + bufsz,decoder->bytes_left_in_chunk);
      }
      bufsz = decoder->bytes_left_in_chunk + bufsz;
      src = decoder->bytes_left_in_chunk + src;
      decoder->bytes_left_in_chunk = 0;
      decoder->_state = '\x03';
switchD_00108b60_caseD_3:
      while( true ) {
        if (bufsz == sVar2) goto LAB_00108e76;
        if (buf[bufsz] != '\r') break;
        bufsz = bufsz + 1;
      }
      if (buf[bufsz] == '\n') {
        bufsz = bufsz + 1;
        decoder->_state = '\0';
        goto LAB_00108b37;
      }
      lStack_40 = -1;
    }
  }
LAB_00108e76:
  if (src != bufsz) {
    memmove(buf + src,buf + bufsz,sVar2 - bufsz);
  }
  *_bufsz = src;
  return lStack_40;
}

Assistant:

ssize_t phr_decode_chunked(struct phr_chunked_decoder *decoder, char *buf, size_t *_bufsz)
{
    size_t dst = 0, src = 0, bufsz = *_bufsz;
    ssize_t ret = -2; /* incomplete */

    while (1) {
        switch (decoder->_state) {
        case CHUNKED_IN_CHUNK_SIZE:
            for (;; ++src) {
                int v;
                if (src == bufsz)
                    goto Exit;
                if ((v = decode_hex(buf[src])) == -1) {
                    if (decoder->_hex_count == 0) {
                        ret = -1;
                        goto Exit;
                    }
                    break;
                }
                if (decoder->_hex_count == sizeof(size_t) * 2) {
                    ret = -1;
                    goto Exit;
                }
                decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk * 16 + v;
                ++decoder->_hex_count;
            }
            decoder->_hex_count = 0;
            decoder->_state = CHUNKED_IN_CHUNK_EXT;
        /* fallthru */
        case CHUNKED_IN_CHUNK_EXT:
            /* RFC 7230 A.2 "Line folding in chunk extensions is disallowed" */
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            if (decoder->bytes_left_in_chunk == 0) {
                if (decoder->consume_trailer) {
                    decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
                    break;
                } else {
                    goto Complete;
                }
            }
            decoder->_state = CHUNKED_IN_CHUNK_DATA;
        /* fallthru */
        case CHUNKED_IN_CHUNK_DATA: {
            size_t avail = bufsz - src;
            if (avail < decoder->bytes_left_in_chunk) {
                if (dst != src)
                    memmove(buf + dst, buf + src, avail);
                src += avail;
                dst += avail;
                decoder->bytes_left_in_chunk -= avail;
                goto Exit;
            }
            if (dst != src)
                memmove(buf + dst, buf + src, decoder->bytes_left_in_chunk);
            src += decoder->bytes_left_in_chunk;
            dst += decoder->bytes_left_in_chunk;
            decoder->bytes_left_in_chunk = 0;
            decoder->_state = CHUNKED_IN_CHUNK_CRLF;
        }
        /* fallthru */
        case CHUNKED_IN_CHUNK_CRLF:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src] != '\012') {
                ret = -1;
                goto Exit;
            }
            ++src;
            decoder->_state = CHUNKED_IN_CHUNK_SIZE;
            break;
        case CHUNKED_IN_TRAILERS_LINE_HEAD:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src++] == '\012')
                goto Complete;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_MIDDLE;
        /* fallthru */
        case CHUNKED_IN_TRAILERS_LINE_MIDDLE:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
            break;
        default:
            assert(!"decoder is corrupt");
        }
    }

Complete:
    ret = bufsz - src;
Exit:
    if (dst != src)
        memmove(buf + dst, buf + src, bufsz - src);
    *_bufsz = dst;
    return ret;
}